

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O3

block_array * __thiscall salsa20::generate_keystream(salsa20 *this)

{
  uint *puVar1;
  uchar *puVar2;
  long lVar3;
  block_array *in_RDI;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  array<unsigned_int,_16UL> x;
  
  x._M_elems._48_8_ = *(undefined8 *)((this->m_array)._M_elems + 0xc);
  x._M_elems._56_8_ = *(undefined8 *)((this->m_array)._M_elems + 0xe);
  x._M_elems._32_8_ = *(undefined8 *)((this->m_array)._M_elems + 8);
  x._M_elems._40_8_ = *(undefined8 *)((this->m_array)._M_elems + 10);
  x._M_elems._16_8_ = *(undefined8 *)((this->m_array)._M_elems + 4);
  x._M_elems._24_8_ = *(undefined8 *)((this->m_array)._M_elems + 6);
  x._M_elems._0_8_ = *(undefined8 *)(this->m_array)._M_elems;
  x._M_elems._8_8_ = *(undefined8 *)((this->m_array)._M_elems + 2);
  in_RDI->_M_elems[0x30] = '\0';
  in_RDI->_M_elems[0x31] = '\0';
  in_RDI->_M_elems[0x32] = '\0';
  in_RDI->_M_elems[0x33] = '\0';
  in_RDI->_M_elems[0x34] = '\0';
  in_RDI->_M_elems[0x35] = '\0';
  in_RDI->_M_elems[0x36] = '\0';
  in_RDI->_M_elems[0x37] = '\0';
  in_RDI->_M_elems[0x38] = '\0';
  in_RDI->_M_elems[0x39] = '\0';
  in_RDI->_M_elems[0x3a] = '\0';
  in_RDI->_M_elems[0x3b] = '\0';
  in_RDI->_M_elems[0x3c] = '\0';
  in_RDI->_M_elems[0x3d] = '\0';
  in_RDI->_M_elems[0x3e] = '\0';
  in_RDI->_M_elems[0x3f] = '\0';
  in_RDI->_M_elems[0x20] = '\0';
  in_RDI->_M_elems[0x21] = '\0';
  in_RDI->_M_elems[0x22] = '\0';
  in_RDI->_M_elems[0x23] = '\0';
  in_RDI->_M_elems[0x24] = '\0';
  in_RDI->_M_elems[0x25] = '\0';
  in_RDI->_M_elems[0x26] = '\0';
  in_RDI->_M_elems[0x27] = '\0';
  in_RDI->_M_elems[0x28] = '\0';
  in_RDI->_M_elems[0x29] = '\0';
  in_RDI->_M_elems[0x2a] = '\0';
  in_RDI->_M_elems[0x2b] = '\0';
  in_RDI->_M_elems[0x2c] = '\0';
  in_RDI->_M_elems[0x2d] = '\0';
  in_RDI->_M_elems[0x2e] = '\0';
  in_RDI->_M_elems[0x2f] = '\0';
  in_RDI->_M_elems[0x10] = '\0';
  in_RDI->_M_elems[0x11] = '\0';
  in_RDI->_M_elems[0x12] = '\0';
  in_RDI->_M_elems[0x13] = '\0';
  in_RDI->_M_elems[0x14] = '\0';
  in_RDI->_M_elems[0x15] = '\0';
  in_RDI->_M_elems[0x16] = '\0';
  in_RDI->_M_elems[0x17] = '\0';
  in_RDI->_M_elems[0x18] = '\0';
  in_RDI->_M_elems[0x19] = '\0';
  in_RDI->_M_elems[0x1a] = '\0';
  in_RDI->_M_elems[0x1b] = '\0';
  in_RDI->_M_elems[0x1c] = '\0';
  in_RDI->_M_elems[0x1d] = '\0';
  in_RDI->_M_elems[0x1e] = '\0';
  in_RDI->_M_elems[0x1f] = '\0';
  in_RDI->_M_elems[0] = '\0';
  in_RDI->_M_elems[1] = '\0';
  in_RDI->_M_elems[2] = '\0';
  in_RDI->_M_elems[3] = '\0';
  in_RDI->_M_elems[4] = '\0';
  in_RDI->_M_elems[5] = '\0';
  in_RDI->_M_elems[6] = '\0';
  in_RDI->_M_elems[7] = '\0';
  in_RDI->_M_elems[8] = '\0';
  in_RDI->_M_elems[9] = '\0';
  in_RDI->_M_elems[10] = '\0';
  in_RDI->_M_elems[0xb] = '\0';
  in_RDI->_M_elems[0xc] = '\0';
  in_RDI->_M_elems[0xd] = '\0';
  in_RDI->_M_elems[0xe] = '\0';
  in_RDI->_M_elems[0xf] = '\0';
  lVar3 = 0;
  do {
    puVar1 = (this->m_array)._M_elems + lVar3;
    uVar4 = x._M_elems[lVar3] + *puVar1;
    uVar5 = x._M_elems[lVar3 + 1] + puVar1[1];
    uVar6 = x._M_elems[lVar3 + 2] + puVar1[2];
    uVar7 = x._M_elems[lVar3 + 3] + puVar1[3];
    x._M_elems[lVar3] = uVar4;
    x._M_elems[lVar3 + 1] = uVar5;
    x._M_elems[lVar3 + 2] = uVar6;
    x._M_elems[lVar3 + 3] = uVar7;
    puVar2 = in_RDI->_M_elems + lVar3 * 4;
    *(uint *)puVar2 = uVar4;
    *(uint *)(puVar2 + 4) = uVar5;
    *(uint *)(puVar2 + 8) = uVar6;
    *(uint *)(puVar2 + 0xc) = uVar7;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  puVar1 = (this->m_array)._M_elems + 8;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  return in_RDI;
}

Assistant:

salsa20::block_array salsa20::generate_keystream()
{
    auto x = m_array;

    for (size_t i = 20; i > 0; --i)
    {
        x[4 ] ^= rotate(static_cast<uint32_t>(x[0 ] + x[12]), 7);
        x[8 ] ^= rotate(static_cast<uint32_t>(x[4 ] + x[0 ]), 9);
        x[12] ^= rotate(static_cast<uint32_t>(x[8 ] + x[4 ]), 13);
        x[0 ] ^= rotate(static_cast<uint32_t>(x[12] + x[8 ]), 18);

        x[9 ] ^= rotate(static_cast<uint32_t>(x[5 ] + x[1 ]), 7);
        x[13] ^= rotate(static_cast<uint32_t>(x[9 ] + x[5 ]), 9);
        x[1 ] ^= rotate(static_cast<uint32_t>(x[13] + x[9 ]), 13);
        x[5 ] ^= rotate(static_cast<uint32_t>(x[1 ] + x[13]), 18);

        x[14] ^= rotate(static_cast<uint32_t>(x[10] + x[6 ]), 7);
        x[2 ] ^= rotate(static_cast<uint32_t>(x[14] + x[10]), 9);
        x[6 ] ^= rotate(static_cast<uint32_t>(x[2 ] + x[14]), 13);
        x[10] ^= rotate(static_cast<uint32_t>(x[6 ] + x[2 ]), 18);

        x[3 ] ^= rotate(static_cast<uint32_t>(x[15] + x[11]), 7);
        x[7 ] ^= rotate(static_cast<uint32_t>(x[3 ] + x[15]), 9);
        x[11] ^= rotate(static_cast<uint32_t>(x[7 ] + x[3 ]), 13);
        x[15] ^= rotate(static_cast<uint32_t>(x[11] + x[7 ]), 18);

        x[1 ] ^= rotate(static_cast<uint32_t>(x[0 ] + x[3 ]), 7);
        x[2 ] ^= rotate(static_cast<uint32_t>(x[1 ] + x[0 ]), 9);
        x[3 ] ^= rotate(static_cast<uint32_t>(x[2 ] + x[1 ]), 13);
        x[0 ] ^= rotate(static_cast<uint32_t>(x[3 ] + x[2 ]), 18);

        x[6 ] ^= rotate(static_cast<uint32_t>(x[5 ] + x[4 ]), 7);
        x[7 ] ^= rotate(static_cast<uint32_t>(x[6 ] + x[5 ]), 9);
        x[4 ] ^= rotate(static_cast<uint32_t>(x[7 ] + x[6 ]), 13);
        x[5 ] ^= rotate(static_cast<uint32_t>(x[4 ] + x[7 ]), 18);

        x[11] ^= rotate(static_cast<uint32_t>(x[10] + x[9 ]), 7);
        x[8 ] ^= rotate(static_cast<uint32_t>(x[11] + x[10]), 9);
        x[9 ] ^= rotate(static_cast<uint32_t>(x[8 ] + x[11]), 13);
        x[10] ^= rotate(static_cast<uint32_t>(x[9 ] + x[8 ]), 18);

        x[12] ^= rotate(static_cast<uint32_t>(x[15] + x[14]), 7);
        x[13] ^= rotate(static_cast<uint32_t>(x[12] + x[15]), 9);
        x[14] ^= rotate(static_cast<uint32_t>(x[13] + x[12]), 13);
        x[15] ^= rotate(static_cast<uint32_t>(x[14] + x[13]), 18);
    }

    std::array<uint8_t, sizes::block_size> result;
    result.fill(0x0);

    for (size_t i = 0; i < sizes::key_array_size; ++i)
    {
        x[i] += m_array[i];

        auto converted = convert(x[i]);
        auto result_start_index = i * sizeof (uint32_t);

        std::copy(converted.begin(), converted.end(), result.begin() + result_start_index);
    }

    auto position = reinterpret_cast<uint64_t *>(&m_array[8]);

    // ++*position - beeeee
    *position = *position + 1;

    return result;
}